

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O0

void __thiscall
xray_re::xr_writer::
w_seq<std::vector<xray_re::xr_token,std::allocator<xray_re::xr_token>>,write_token>
          (xr_writer *this,vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_> *container)

{
  bool bVar1;
  reference t;
  __normal_iterator<const_xray_re::xr_token_*,_std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>_>
  local_30;
  const_iterator end;
  const_iterator it;
  vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_> *container_local;
  xr_writer *this_local;
  
  end = std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>::begin(container);
  local_30._M_current =
       (xr_token *)
       std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>::end(container);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_30);
    if (!bVar1) break;
    t = __gnu_cxx::
        __normal_iterator<const_xray_re::xr_token_*,_std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>_>
        ::operator*(&end);
    write_token::operator()((write_token *)((long)&this_local + 7),t,this);
    __gnu_cxx::
    __normal_iterator<const_xray_re::xr_token_*,_std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>_>
    ::operator++(&end);
  }
  return;
}

Assistant:

inline void xr_writer::w_seq(const T& container, F write)
{
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it) {
		write(*it, *this);
	}
}